

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O3

PackedFile * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::PackedFile>
          (Structure *this,shared_ptr<Assimp::Blender::PackedFile> *out,size_t *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  PackedFile *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  __p = (PackedFile *)operator_new(0x28);
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)0x0;
  (__p->super_ElemBase).dna_type = (char *)0x0;
  __p->size = 0;
  __p->seek = 0;
  (__p->data).super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__PackedFile_007e10e8;
  (__p->data).super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->data).super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::Blender::PackedFile*>
            (&_Stack_20,__p);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (out->super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (out->super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = __p;
  (out->super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }